

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AllocatedSizeAtCapacity
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  uint uVar3;
  bool bVar4;
  
  iVar1 = this->current_size_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar2 = rep(this);
    uVar3 = pRVar2->allocated_size;
  }
  if ((int)uVar3 < iVar1) {
    AllocatedSizeAtCapacity();
  }
  else {
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar3 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar2 = rep(this);
      uVar3 = pRVar2->allocated_size;
    }
    if ((int)uVar3 <= this->capacity_proxy_ + 1) {
      if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
        bVar4 = this->tagged_rep_or_elem_ != (void *)0x0;
      }
      else {
        pRVar2 = rep(this);
        bVar4 = this->capacity_proxy_ < pRVar2->allocated_size;
      }
      return bVar4;
    }
  }
  AllocatedSizeAtCapacity();
}

Assistant:

inline bool AllocatedSizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This combines optimization mentioned in `SizeAtCapacity()` and simplifies
    // `allocated_size()` in sso case.
    return using_sso() ? (tagged_rep_or_elem_ != nullptr)
                       : rep()->allocated_size >= Capacity();
  }